

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makelevelset3.cpp
# Opt level: O2

float point_segment_distance(Vec3f *x0,Vec3f *x1,Vec3f *x2)

{
  float fVar1;
  float fVar2;
  undefined1 extraout_var [12];
  undefined1 in_ZMM0 [64];
  undefined1 auVar8 [56];
  undefined1 extraout_var_00 [56];
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  Vec<3U,_float> VVar9;
  Vec<3U,_float> local_60;
  Vec<3U,_float> local_50;
  Vec<3U,_float> local_40;
  Vec<3U,_float> local_30;
  
  auVar8 = in_ZMM0._8_56_;
  VVar9 = Vec<3U,_float>::operator-(x2,x1);
  local_30.v[2] = VVar9.v[2];
  auVar4._0_8_ = VVar9.v._0_8_;
  auVar4._8_56_ = auVar8;
  local_30.v._0_8_ = vmovlps_avx(auVar4._0_16_);
  fVar1 = mag2<3u,float>(&local_30);
  auVar8 = extraout_var_00;
  VVar9 = Vec<3U,_float>::operator-(x2,x0);
  local_60.v[2] = VVar9.v[2];
  auVar3._0_8_ = VVar9.v._0_8_;
  auVar3._8_56_ = auVar8;
  local_60.v._0_8_ = vmovlps_avx(auVar3._0_16_);
  fVar2 = dot<3u,float>(&local_60,&local_30);
  fVar2 = fVar2 / fVar1;
  auVar4 = ZEXT1264(ZEXT812(0));
  if ((0.0 <= fVar2) && (auVar4 = ZEXT1664(CONCAT124(extraout_var,fVar2)), 1.0 < fVar2)) {
    auVar4 = ZEXT464(0x3f800000);
  }
  auVar8 = auVar4._8_56_;
  VVar9 = operator*(auVar4._0_4_,x1);
  local_40.v[2] = VVar9.v[2];
  auVar5._0_8_ = VVar9.v._0_8_;
  auVar5._8_56_ = auVar8;
  local_40.v._0_8_ = vmovlps_avx(auVar5._0_16_);
  auVar8 = (undefined1  [56])0x0;
  VVar9 = operator*(1.0 - auVar4._0_4_,x2);
  local_50.v[2] = VVar9.v[2];
  auVar6._0_8_ = VVar9.v._0_8_;
  auVar6._8_56_ = auVar8;
  local_50.v._0_8_ = vmovlps_avx(auVar6._0_16_);
  VVar9 = Vec<3U,_float>::operator+(&local_40,&local_50);
  local_60.v[2] = VVar9.v[2];
  auVar7._0_8_ = VVar9.v._0_8_;
  auVar7._8_56_ = auVar8;
  local_60.v._0_8_ = vmovlps_avx(auVar7._0_16_);
  fVar1 = dist<3u,float>(x0,&local_60);
  return fVar1;
}

Assistant:

static float point_segment_distance(const Vec3f &x0, const Vec3f &x1, const Vec3f &x2) {
  Vec3f dx(x2 - x1);
  double m2 = mag2(dx);
  // find parameter value of closest point on segment
  float s12 = (float)(dot(x2 - x0, dx) / m2);
  if (s12 < 0) {
    s12 = 0;
  } else if (s12 > 1) {
    s12 = 1;
  }
  // and find the distance
  return dist(x0, s12 * x1 + (1 - s12) * x2);
}